

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 tcu::sampleNearest1D(ConstPixelBufferAccess *access,Sampler *sampler,float u,IVec2 *offset)

{
  WrapMode WVar1;
  WrapMode WVar2;
  TextureChannelClass TVar3;
  uint uVar4;
  int in_ECX;
  WrapMode WVar5;
  WrapMode WVar6;
  int iVar7;
  Vector<float,_4> *res;
  int in_R8D;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 in_XMM1_Qa;
  float fVar12;
  float fVar13;
  float fVar14;
  Vec4 VVar16;
  Vec4 VVar17;
  TextureFormat local_48;
  uint uStack_40;
  uint uStack_3c;
  undefined1 auVar18 [12];
  undefined8 uVar19;
  undefined8 uVar11;
  Vector<float,_4> VVar15;
  
  WVar1 = sampler->wrapR;
  uVar11 = in_XMM1_Qa;
  fVar8 = floorf(u);
  if (6 < (uint)offset->m_data[0]) {
    WVar6 = CLAMP_TO_EDGE;
    goto LAB_00a34fa2;
  }
  WVar5 = (int)fVar8 + in_ECX;
  WVar6 = WVar5;
  switch(offset->m_data[0]) {
  default:
    WVar2 = WVar1 - CLAMP_TO_BORDER;
    if ((int)WVar5 < (int)(WVar1 - CLAMP_TO_BORDER)) {
      WVar2 = WVar5;
    }
    WVar6 = CLAMP_TO_EDGE;
    if (-1 < (int)WVar5) {
      WVar6 = WVar2;
    }
    break;
  case 1:
    if (-1 < (int)WVar5 && (int)WVar5 < (int)WVar1) break;
    TVar3 = getTextureChannelClass(sampler->wrapT);
    switch(TVar3) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      VVar15 = sampleTextureBorder<float>(&access->m_format,sampler);
      VVar16.m_data[0] = VVar15.m_data[0];
      auVar18._4_4_ = VVar15.m_data[1];
      register0x00001240 = VVar15.m_data[2];
      register0x00001244 = VVar15.m_data[3];
      return (Vec4)VVar16.m_data;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_48,sampler);
      (access->m_format).order = R;
      (access->m_format).type = SNORM_INT8;
      (access->m_size).m_data[0] = 0;
      (access->m_size).m_data[1] = 0;
      fVar8 = (float)(int)local_48.order;
      fVar9 = (float)(int)local_48.type;
      fVar10 = (float)(int)uStack_40;
      fVar12 = (float)(int)uStack_3c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_48,sampler);
      fVar8 = 0.0;
      fVar9 = 0.0;
      (access->m_format).order = R;
      (access->m_format).type = SNORM_INT8;
      (access->m_size).m_data[0] = 0;
      (access->m_size).m_data[1] = 0;
      fVar10 = ((float)(local_48.order >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(local_48.order & 0xffff | 0x4b000000);
      fVar12 = ((float)(local_48.type >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(local_48.type & 0xffff | 0x4b000000);
      uVar11 = CONCAT44(fVar12,fVar10);
      fVar13 = ((float)(uStack_40 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uStack_40 & 0xffff | 0x4b000000);
      fVar14 = ((float)(uStack_3c >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uStack_3c & 0xffff | 0x4b000000);
      (access->m_format).order = (ChannelOrder)fVar10;
      (access->m_format).type = (ChannelType)fVar12;
      (access->m_size).m_data[0] = (int)fVar13;
      (access->m_size).m_data[1] = (int)fVar14;
      goto LAB_00a35035;
    default:
      fVar8 = -1.0;
      fVar9 = -1.0;
      fVar10 = -1.0;
      fVar12 = -1.0;
    }
    (access->m_format).order = (ChannelOrder)fVar8;
    (access->m_format).type = (ChannelType)fVar9;
    (access->m_size).m_data[0] = (int)fVar10;
    (access->m_size).m_data[1] = (int)fVar12;
LAB_00a35035:
    VVar17.m_data[1] = fVar9;
    VVar17.m_data[0] = fVar8;
    VVar17.m_data[2] = (float)(int)uVar11;
    VVar17.m_data[3] = (float)(int)((ulong)uVar11 >> 0x20);
    return (Vec4)VVar17.m_data;
  case 2:
  case 3:
    WVar6 = ((int)WVar5 % (int)WVar1 >> 0x1f & WVar1) + (int)WVar5 % (int)WVar1;
    break;
  case 6:
    WVar6 = WVar1;
    if ((int)WVar5 < (int)WVar1) {
      WVar6 = WVar5;
    }
    if (SBORROW4(WVar5,-WVar1) != (int)(WVar5 + WVar1) < 0) {
      WVar6 = -WVar1;
    }
  case 4:
    iVar7 = (int)WVar6 % (int)(WVar1 * 2);
    uVar4 = (iVar7 - WVar1) + (iVar7 >> 0x1f & WVar1 * 2);
    WVar6 = ~((int)uVar4 >> 0x1f ^ uVar4) + WVar1;
  }
LAB_00a34fa2:
  VVar17 = lookup(access,(int)sampler,WVar6,in_R8D);
  return (Vec4)VVar17.m_data;
}

Assistant:

static Vec4 sampleNearest1D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, const IVec2& offset)
{
	int width	= access.getWidth();

	int x = deFloorFloatToInt32(u)+offset.x();

	// Check for CLAMP_TO_BORDER.
	if (sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);

	return lookup(access, i, offset.y(), 0);
}